

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_attr_parent(lyd_node *root,lyd_attr *attr)

{
  lys_ext_instance_complex *local_38;
  lyd_attr *node_attr;
  lyd_node *elem;
  lyd_node *next;
  lyd_attr *attr_local;
  lyd_node *root_local;
  
  node_attr = (lyd_attr *)root;
  do {
    if (node_attr == (lyd_attr *)0x0) {
      return (lyd_node *)0x0;
    }
    for (local_38 = node_attr->annotation; local_38 != (lys_ext_instance_complex *)0x0;
        local_38 = (lys_ext_instance_complex *)local_38->parent) {
      if (local_38 == (lys_ext_instance_complex *)attr) {
        return (lyd_node *)node_attr;
      }
    }
    if (((ulong)node_attr->parent->ht & 0x802c) == 0) {
      elem = (lyd_node *)node_attr[1].next;
    }
    else {
      elem = (lyd_node *)0x0;
    }
    if (elem == (lyd_node *)0x0) {
      if ((lyd_node *)node_attr == root) {
        return (lyd_node *)0x0;
      }
      elem = (lyd_node *)node_attr->name;
    }
    while ((elem == (lyd_node *)0x0 &&
           (node_attr = (lyd_attr *)(node_attr->value).instance,
           ((lyd_node *)node_attr)->parent != root->parent))) {
      elem = ((lyd_node *)node_attr)->next;
    }
    node_attr = (lyd_attr *)elem;
  } while( true );
}

Assistant:

const struct lyd_node *
lyd_attr_parent(const struct lyd_node *root, struct lyd_attr *attr)
{
    const struct lyd_node *next, *elem;
    struct lyd_attr *node_attr;

    LY_TREE_DFS_BEGIN(root, next, elem) {
        for (node_attr = elem->attr; node_attr; node_attr = node_attr->next) {
            if (node_attr == attr) {
                return elem;
            }
        }
        LY_TREE_DFS_END(root, next, elem)
    }

    return NULL;
}